

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O0

void __thiscall QHeaderView::initStyleOption(QHeaderView *this,QStyleOptionHeader *option)

{
  long lVar1;
  bool bVar2;
  QFlags<QStyle::StateFlag> QVar3;
  QHeaderViewPrivate *pQVar4;
  QWidget *in_RSI;
  QStyleOption *in_RDI;
  long in_FS_OFFSET;
  QHeaderViewPrivate *d;
  QStyleOption *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pQVar4 = d_func((QHeaderView *)0x8412cf);
  QStyleOption::initFrom(this_00,in_RSI);
  QVar3 = ::operator|((enum_type)((ulong)in_RDI >> 0x20),(enum_type)in_RDI);
  *(QFlagsStorageHelper<QStyle::StateFlag,_4> *)&in_RSI->field_0x8 =
       QVar3.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.super_QFlagsStorage<QStyle::StateFlag>.
       i;
  *(Orientation *)&in_RSI[3].field_0x8 = pQVar4->orientation;
  if (pQVar4->orientation == Horizontal) {
    QFlags<QStyle::StateFlag>::operator|=
              ((QFlags<QStyle::StateFlag> *)&in_RSI->field_0x8,State_Horizontal);
  }
  bVar2 = QWidget::isEnabled((QWidget *)0x841340);
  if (bVar2) {
    QFlags<QStyle::StateFlag>::operator|=
              ((QFlags<QStyle::StateFlag> *)&in_RSI->field_0x8,State_Enabled);
  }
  *(undefined4 *)&in_RSI[1].field_0x18 = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHeaderView::initStyleOption(QStyleOptionHeader *option) const
{
    Q_D(const QHeaderView);
    option->initFrom(this);
    option->state = QStyle::State_None | QStyle::State_Raised;
    option->orientation = d->orientation;
    if (d->orientation == Qt::Horizontal)
        option->state |= QStyle::State_Horizontal;
    if (isEnabled())
        option->state |= QStyle::State_Enabled;
    option->section = 0;
}